

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O0

void __thiscall vw::finish_example(vw *this,multi_ex *ec)

{
  undefined8 uVar1;
  long in_RDI;
  stringstream __msg;
  vw *in_stack_fffffffffffffe18;
  learner<char,_std::vector<example_*,_std::allocator<example_*>_>_> *in_stack_fffffffffffffe20;
  string *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  vw_exception *in_stack_fffffffffffffe50;
  stringstream local_198 [16];
  ostream local_188;
  learner<char,_char> *in_stack_ffffffffffffffe0;
  
  if ((*(byte *)(*(long *)(in_RDI + 0x28) + 0xe8) & 1) == 0) {
    std::__cxx11::stringstream::stringstream(local_198);
    std::operator<<(&local_188,"This reduction does not support multi-line example.");
    uVar1 = __cxa_allocate_exception(0x38);
    std::__cxx11::stringstream::str();
    VW::vw_exception::vw_exception
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
               in_stack_fffffffffffffe38);
    __cxa_throw(uVar1,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
  }
  LEARNER::as_multiline<char,char>(in_stack_ffffffffffffffe0);
  LEARNER::learner<char,_std::vector<example_*,_std::allocator<example_*>_>_>::finish_example
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
             (vector<example_*,_std::allocator<example_*>_> *)0x356202);
  return;
}

Assistant:

void vw::finish_example(multi_ex& ec)
{
  if (!l->is_multiline)
    THROW("This reduction does not support multi-line example.");

  LEARNER::as_multiline(l)->finish_example(*this, ec);
}